

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  long lVar6;
  void *in_RDI;
  FmsIOFieldInfo *finfo;
  FmsInt i_4;
  FmsInt nfields;
  FmsIOFieldDescriptorInfo *fd_info;
  FmsInt i_3;
  FmsInt nfds;
  FmsIOTagInfo *tinfo;
  FmsInt i_2;
  FmsInt ntags;
  FmsInt nrelations;
  FmsInt k_1;
  FmsIOComponentPartInfo *pinfo;
  FmsInt j_1;
  FmsInt nparts;
  FmsIOComponentInfo *comp_info;
  FmsInt i_1;
  FmsInt ncomponents;
  FmsIOEntityInfo *einfo;
  FmsInt dim;
  FmsIODomainInfo *dinfo;
  FmsInt k;
  FmsInt ndoms;
  FmsInt j;
  FmsInt i;
  FmsInt ndomnames;
  FmsIOMetaDataInfo *local_d0;
  FmsIOMetaDataInfo *minfo;
  ulong local_b8;
  ulong local_a0;
  ulong local_88;
  ulong local_78;
  ulong local_60;
  ulong local_38;
  ulong local_28;
  ulong local_20;
  int local_4;
  
  if (in_RDI == (void *)0x0) {
    local_4 = 1;
  }
  else {
    uVar1 = *(ulong *)(*(long *)((long)in_RDI + 0x28) + 8);
    if (uVar1 != 0) {
      for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
        uVar2 = *(ulong *)(*(long *)(*(long *)((long)in_RDI + 0x28) + 0x20) + local_20 * 0x18 + 8);
        for (local_28 = 0; local_28 < uVar2; local_28 = local_28 + 1) {
          puVar4 = (ulong *)(*(long *)(*(long *)(*(long *)((long)in_RDI + 0x28) + 0x20) +
                                       local_20 * 0x18 + 0x10) + local_28 * 0x18);
          uVar3 = *puVar4;
          for (local_38 = 0; local_38 < uVar3; local_38 = local_38 + 1) {
            lVar5 = puVar4[2] + local_38 * 0x28;
            if (*(long *)(lVar5 + 0x20) != 0) {
              free(*(void **)(lVar5 + 0x20));
            }
          }
          if (puVar4[2] != 0) {
            free((void *)puVar4[2]);
          }
        }
        if (*(long *)(*(long *)(*(long *)((long)in_RDI + 0x28) + 0x20) + local_20 * 0x18 + 0x10) !=
            0) {
          free(*(void **)(*(long *)(*(long *)((long)in_RDI + 0x28) + 0x20) + local_20 * 0x18 + 0x10)
              );
        }
      }
      if (*(long *)(*(long *)((long)in_RDI + 0x28) + 0x20) != 0) {
        free(*(void **)(*(long *)((long)in_RDI + 0x28) + 0x20));
      }
    }
    uVar1 = *(ulong *)(*(long *)((long)in_RDI + 0x28) + 0x10);
    if (uVar1 != 0) {
      for (local_60 = 0; local_60 < uVar1; local_60 = local_60 + 1) {
        lVar5 = *(long *)(*(long *)((long)in_RDI + 0x28) + 0x28) + local_60 * 0x48;
        uVar2 = *(ulong *)(lVar5 + 0x20);
        for (local_78 = 0; local_78 < uVar2; local_78 = local_78 + 1) {
          lVar6 = *(long *)(lVar5 + 0x28) + local_78 * 0x160;
          for (local_88 = 0; local_88 < 8; local_88 = local_88 + 1) {
            if ((*(long *)(lVar6 + local_88 * 0x28 + 0x28) != 0) &&
               (*(long *)(lVar6 + local_88 * 0x28 + 0x40) != 0)) {
              free(*(void **)(lVar6 + local_88 * 0x28 + 0x40));
            }
          }
        }
        if (*(long *)(lVar5 + 0x28) != 0) {
          free(*(void **)(lVar5 + 0x28));
        }
        if ((*(long *)(lVar5 + 0x30) != 0) && (*(long *)(lVar5 + 0x40) != 0)) {
          free(*(void **)(lVar5 + 0x40));
        }
      }
      if (*(long *)(*(long *)((long)in_RDI + 0x28) + 0x28) != 0) {
        free(*(void **)(*(long *)((long)in_RDI + 0x28) + 0x28));
      }
    }
    uVar1 = *(ulong *)(*(long *)((long)in_RDI + 0x28) + 0x18);
    if (uVar1 != 0) {
      for (local_a0 = 0; local_a0 < uVar1; local_a0 = local_a0 + 1) {
        lVar5 = *(long *)(*(long *)((long)in_RDI + 0x28) + 0x30) + local_a0 * 0x40;
        if (*(long *)(lVar5 + 0x18) != 0) {
          free(*(void **)(lVar5 + 0x18));
        }
        if (*(long *)(lVar5 + 0x30) != 0) {
          free(*(void **)(lVar5 + 0x30));
        }
        if (*(long *)(lVar5 + 0x38) != 0) {
          free(*(void **)(lVar5 + 0x38));
        }
      }
      if (*(long *)(*(long *)((long)in_RDI + 0x28) + 0x30) != 0) {
        free(*(void **)(*(long *)((long)in_RDI + 0x28) + 0x30));
      }
    }
    if (**(long **)((long)in_RDI + 0x28) != 0) {
      free((void *)**(undefined8 **)((long)in_RDI + 0x28));
    }
    if (*(long *)((long)in_RDI + 0x28) != 0) {
      free(*(void **)((long)in_RDI + 0x28));
    }
    uVar1 = *(ulong *)((long)in_RDI + 8);
    if (uVar1 != 0) {
      for (local_b8 = 0; local_b8 < uVar1; local_b8 = local_b8 + 1) {
        lVar5 = *(long *)((long)in_RDI + 0x10) + local_b8 * 0x28;
        if (*(long *)(lVar5 + 0x18) != 0) {
          free(*(void **)(lVar5 + 0x18));
        }
      }
      if (*(long *)((long)in_RDI + 0x10) != 0) {
        free(*(void **)((long)in_RDI + 0x10));
      }
    }
    minfo = *(FmsIOMetaDataInfo **)((long)in_RDI + 0x18);
    if (minfo != (FmsIOMetaDataInfo *)0x0) {
      for (local_d0 = (FmsIOMetaDataInfo *)0x0; local_d0 < minfo;
          local_d0 = (FmsIOMetaDataInfo *)((long)&local_d0->mdtype + 1)) {
        lVar5 = *(long *)((long)in_RDI + 0x20) + (long)local_d0 * 0x40;
        if (*(long *)(lVar5 + 0x30) != 0) {
          free(*(void **)(lVar5 + 0x30));
        }
        if ((*(long *)(lVar5 + 0x38) != 0) &&
           (FmsIODestroyFmsIOMetaDataInfo(minfo), *(long *)(lVar5 + 0x38) != 0)) {
          free(*(void **)(lVar5 + 0x38));
        }
      }
      if (*(long *)((long)in_RDI + 0x20) != 0) {
        free(*(void **)((long)in_RDI + 0x20));
      }
    }
    if ((*(long *)((long)in_RDI + 0x30) != 0) &&
       (FmsIODestroyFmsIOMetaDataInfo(minfo), *(long *)((long)in_RDI + 0x30) != 0)) {
      free(*(void **)((long)in_RDI + 0x30));
    }
    if (in_RDI != (void *)0x0) {
      free(in_RDI);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info) {
  if(!dc_info) E_RETURN(1);

  // Destroy DomainNameInfos & DomainInfos
  const FmsInt ndomnames = dc_info->mesh_info->ndomain_names;
  if(ndomnames) {
    FmsInt i;
    for(i = 0; i < ndomnames; i++) {
      FmsInt j;
      FmsInt ndoms = dc_info->mesh_info->domain_names[i].ndomains;
      for(j = 0; j < ndoms; j++) {
        FmsInt k = 0;
        FmsIODomainInfo *dinfo = &dc_info->mesh_info->domain_names[i].domains[j];
        const FmsInt dim = dinfo->dim;
        for(k = 0; k < dim; k++) {
          FmsIOEntityInfo *einfo = &dinfo->entities[k];
          FREE(einfo->values);
          // FREE(einfo); // It's a 1-D array
        }
        FREE(dinfo->entities);
      }
      FREE(dc_info->mesh_info->domain_names[i].domains);
    }
    FREE(dc_info->mesh_info->domain_names);
  }

  // Destroy ComponentInfos
  const FmsInt ncomponents = dc_info->mesh_info->ncomponents;
  if(ncomponents) {
    FmsInt i;
    for(i = 0; i < ncomponents; i++) {
      FmsIOComponentInfo *comp_info = &dc_info->mesh_info->components[i];
      const FmsInt nparts = comp_info->nparts;
      FmsInt j;
      for(j = 0; j < nparts; j++) {
        FmsIOComponentPartInfo *pinfo = &comp_info->parts[j];
        FmsInt k;
        for(k = 0; k < FMS_NUM_ENTITY_TYPES; k++) {
          if(pinfo->entities[k].nents)
            FREE(pinfo->entities[k].values);
        }
      }
      FREE(comp_info->parts);
      // Add the component relations
      const FmsInt nrelations = comp_info->relation_size;
      if(nrelations) {
        FREE(comp_info->relation_values);
      }
    }
    FREE(dc_info->mesh_info->components);
  }

  // Destroy TagInfos
  const FmsInt ntags = dc_info->mesh_info->ntags;
  if(ntags) {
    FmsInt i;
    for(i = 0; i < ntags; i++) {
      FmsIOTagInfo *tinfo = &dc_info->mesh_info->tags[i];
      FREE(tinfo->values);
      FREE(tinfo->tag_values);
      FREE(tinfo->descriptions);
    }
    FREE(dc_info->mesh_info->tags);
  }

  FREE(dc_info->mesh_info->partition_info);
  FREE(dc_info->mesh_info);

  // Add FieldDescriptors
  const FmsInt nfds = dc_info->nfds;
  if(nfds) {
    FmsInt i;
    for(i = 0; i < nfds; i++) {
      FmsIOFieldDescriptorInfo *fd_info = &dc_info->fds[i];
      FREE(fd_info->fixed_order);
    }
    FREE(dc_info->fds);
  }

  const FmsInt nfields = dc_info->nfields;
  if(nfields) {
    FmsInt i;
    for(i = 0; i < nfields; i++) {
      FmsIOFieldInfo *finfo = &dc_info->fields[i];
      FREE(finfo->data);
      if(finfo->md) {
        FmsIODestroyFmsIOMetaDataInfo(finfo->md);
        FREE(finfo->md);
      }
    }
    FREE(dc_info->fields);
  }

  // If we have MetaData destroy it
  if(dc_info->md) {
    FmsIODestroyFmsIOMetaDataInfo(dc_info->md);
    FREE(dc_info->md);
  }

  FREE(dc_info);

  return 0;
}